

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O3

void __thiscall FFTAnalyzer::Cleanup(FFTAnalyzer *this)

{
  if (this->window != (float *)0x0) {
    operator_delete__(this->window);
  }
  if (this->ibuffer != (float *)0x0) {
    operator_delete__(this->ibuffer);
  }
  if (this->obuffer != (float *)0x0) {
    operator_delete__(this->obuffer);
  }
  if (this->ispec1 != (float *)0x0) {
    operator_delete__(this->ispec1);
  }
  if (this->ispec2 != (float *)0x0) {
    operator_delete__(this->ispec2);
  }
  if (this->ospec1 != (float *)0x0) {
    operator_delete__(this->ospec1);
  }
  if (this->ospec2 != (float *)0x0) {
    operator_delete__(this->ospec2);
  }
  if (this->cspec != (UnityComplexNumber *)0x0) {
    operator_delete__(this->cspec);
    return;
  }
  return;
}

Assistant:

void FFTAnalyzer::Cleanup()
{
    delete[] window;
    delete[] ibuffer;
    delete[] obuffer;
    delete[] ispec1;
    delete[] ispec2;
    delete[] ospec1;
    delete[] ospec2;
    delete[] cspec;
}